

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void CTcSymObj::s_gen_code_member
               (int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,vm_obj_id_t obj_id,
               int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  undefined4 in_EAX;
  uint uVar4;
  undefined4 in_register_0000000c;
  size_t sVar5;
  CTcGenTarg *pCVar6;
  undefined4 uStack_38;
  int local_34;
  
  sVar5 = CONCAT44(in_register_0000000c,argc);
  _uStack_38 = CONCAT44(discard,in_EAX);
  uVar4 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])(prop_expr,1);
  if ((argc != 0) &&
     (sVar5 = CONCAT71((int7)((ulong)G_cg >> 8),~G_cg->field_0xd0), (~G_cg->field_0xd0 & 0x18) == 0)
     ) {
    err_throw(0x9c5);
  }
  if ((short)uVar4 == 0) {
    CTcGenTarg::write_op(G_cg,'\a');
    CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)obj_id);
    pCVar6 = G_cg;
    uVar4 = G_cg->sp_depth_;
    sVar5 = (size_t)uVar4;
    G_cg->sp_depth_ = uVar4 + 1;
    if (pCVar6->max_sp_depth_ <= (int)uVar4) {
      pCVar6->max_sp_depth_ = uVar4 + 1;
    }
    if (varargs != 0) {
      CTcGenTarg::write_op(pCVar6,0x8d);
    }
    (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
              (prop_expr,0,(ulong)(uint)prop_is_expr);
    if ((~G_cg->field_0xd0 & 0x18) == 0) {
      pCVar6 = G_cg;
      CTcGenTarg::write_op(G_cg,'i');
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,0x8d);
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'b');
      uStack_38 = CONCAT13((char)argc,(undefined3)uStack_38);
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 3,(void *)0x1,sVar5);
    }
    G_cg->sp_depth_ = (G_cg->sp_depth_ - argc) + -2;
  }
  else {
    uVar4 = uVar4 & 0xffff;
    if ((~G_cg->field_0xd0 & 0x18) == 0) {
      CTcGenTarg::write_op(G_cg,'\a');
      CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)obj_id);
      CTcGenTarg::write_op(G_cg,'h');
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
      pCVar3->sp_depth_ = pCVar3->sp_depth_ + -1;
    }
    else if (argc == 0) {
      CTcGenTarg::write_op(G_cg,'f');
      CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)obj_id);
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'g');
      uStack_38._0_3_ = CONCAT12((char)argc,(undefined2)uStack_38);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 2,(void *)0x1,sVar5);
      CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)obj_id);
      pCVar6 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4);
      G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
    }
  }
  CTcGenTarg::post_call_cleanup(pCVar6,named_args);
  if (local_34 == 0) {
    CTcGenTarg::write_op(G_cg,0x8b);
    pCVar6 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar1 = iVar2 + 1;
    G_cg->sp_depth_ = iVar1;
    if (pCVar6->max_sp_depth_ <= iVar2) {
      pCVar6->max_sp_depth_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTcSymObj::s_gen_code_member(int discard,
                                  CTcPrsNode *prop_expr, int prop_is_expr,
                                  int argc, vm_obj_id_t obj_id,
                                  int varargs, CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* 
     *   generate the property expression - don't generate the code right
     *   now even if code generation is necessary, because this isn't the
     *   right place for it; for now, simply check to determine if we're
     *   going to need to generate any code for the property expression 
     */
    prop = prop_expr->gen_code_propid(TRUE, prop_is_expr);

    /* don't allow method calls with arguments in speculative mode */
    if (argc != 0 && G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);
    
    /* check for a constant property value */
    if (prop != VM_INVALID_PROP)
    {
        /* generate an OBJGETPROP or OBJCALLPROP as appropriate */
        if (G_cg->is_speculative())
        {
            /* speculative evaluation - use GETPROPDATA */
            G_cg->write_op(OPC_PUSHOBJ);
            G_cs->write_obj_id(obj_id);
            G_cg->write_op(OPC_GETPROPDATA);
            G_cs->write_prop_id(prop);

            /* we pushed the object, then popped it */
            G_cg->note_push();
            G_cg->note_pop();
        }
        else if (argc == 0)
        {
            /* no arguments - use OBJGETPROP */
            G_cg->write_op(OPC_OBJGETPROP);
            G_cs->write_obj_id(obj_id);
            G_cs->write_prop_id(prop);
        }
        else
        {
            /* generate a varargs modifier if needed */
            if (varargs)
                G_cg->write_op(OPC_VARARGC);
            
            /* arguments - use OBJCALLPROP */
            G_cg->write_op(OPC_OBJCALLPROP);
            G_cs->write((char)argc);
            G_cs->write_obj_id(obj_id);
            G_cs->write_prop_id(prop);

            /* objcallprop removes arguments */
            G_cg->note_pop(argc);
        }
    }
    else
    {
        /* 
         *   non-constant property value - we must first push the object
         *   value, then push the property value, then write a PTRCALLPROP
         *   instruction 
         */

        /* generate the object push */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(obj_id);

        /* note the pushes */
        G_cg->note_push();

        /* keep the argument counter on top if necessary */
        if (varargs)
            G_cg->write_op(OPC_SWAP);

        /* generate the property push */
        prop_expr->gen_code_propid(FALSE, prop_is_expr);

        /* generate the PTRCALLPROP or PTRGETPROPDATA */
        if (G_cg->is_speculative())
        {
            /* speculative - use the data-only property evaluation */
            G_cg->write_op(OPC_PTRGETPROPDATA);
        }
        else
        {
            /* 
             *   if we have a varargs list, modify the call instruction
             *   that follows to make it a varargs call 
             */
            if (varargs)
            {
                /* swap to get the arg counter back on top */
                G_cg->write_op(OPC_SWAP);
                
                /* write the varargs modifier */
                G_cg->write_op(OPC_VARARGC);
            }
            
            /* normal - call the property */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write((int)argc);
        }

        /* ptrcallprop removes the arguments, the object, and the property */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if they want the result, push it onto the stack */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}